

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Bits testing::internal::FloatingPoint<double>::SignAndMagnitudeToBiased(Bits *sam)

{
  Bits *sam_local;
  
  if ((*sam & 0x8000000000000000) == 0) {
    sam_local = (Bits *)(*sam | 0x8000000000000000);
  }
  else {
    sam_local = (Bits *)((*sam ^ 0xffffffffffffffff) + 1);
  }
  return (Bits)sam_local;
}

Assistant:

static Bits SignAndMagnitudeToBiased(const Bits &sam) {
    if (kSignBitMask & sam) {
      // sam represents a negative number.
      return ~sam + 1;
    } else {
      // sam represents a positive number.
      return kSignBitMask | sam;
    }
  }